

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::InsertLoads(LinearScan *this,StackSym *sym,RegNum reg)

{
  code *pcVar1;
  bool bVar2;
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  undefined4 *puVar3;
  Type *ppIVar4;
  undefined1 local_40 [8];
  Iterator __iter;
  
  this_00 = (SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)((long)sym->scratch + 0x30);
  local_40 = (undefined1  [8])this_00;
  __iter.list = (SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)this_00;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  while( true ) {
    if (__iter.list == (SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    __iter.list = (SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
                  ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])__iter.list == local_40) break;
    ppIVar4 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_40);
    InsertLoad(this,*ppIVar4,sym,reg);
  }
  __iter.list = (SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(this_00);
  return;
}

Assistant:

void
LinearScan::InsertLoads(StackSym *sym, RegNum reg)
{
    Lifetime *lifetime = sym->scratch.linearScan.lifetime;

    FOREACH_SLIST_ENTRY(IR::Instr *, instr, &lifetime->useList)
    {
        this->InsertLoad(instr, sym, reg);
    } NEXT_SLIST_ENTRY;

    lifetime->useList.Clear();
}